

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t *
Gia_ManSpecReduce(Gia_Man_t *p,int fDualOut,int fSynthesis,int fSpeculate,int fSkipSome,int fVerbose
                 )

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vTrace;
  int *piVar4;
  Gia_Man_t *pGVar5;
  Vec_Int_t *vTrace_00;
  Vec_Int_t *vXorLits;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar16 = "Gia_ManSpecReduce(): Equivalence classes are not available.\n";
  }
  else {
    if ((fDualOut == 0) || ((p->vCos->nSize - p->nRegs & 1U) == 0)) {
      vTrace_00 = (Vec_Int_t *)0x0;
      iVar17 = 0;
      if (fSkipSome == 0) {
        vTrace = (Vec_Int_t *)0x0;
      }
      else {
        vTrace = (Vec_Int_t *)malloc(0x10);
        vTrace->nCap = 100;
        vTrace->nSize = 0;
        piVar4 = (int *)malloc(400);
        vTrace->pArray = piVar4;
        pGVar5 = Gia_ManSpecReduceTrace(p,vTrace,(Vec_Int_t *)0x0);
        Gia_ManStop(pGVar5);
        if (0 < (long)p->nObjs) {
          lVar15 = 0;
          iVar17 = 0;
          do {
            iVar17 = (iVar17 + 1) - (uint)((~(uint)p->pReprs[lVar15] & 0xfffffff) == 0);
            lVar15 = lVar15 + 1;
          } while (p->nObjs != lVar15);
        }
        if (vTrace->nSize != iVar17) {
          __assert_fail("Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x4be,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)")
          ;
        }
        vTrace_00 = (Vec_Int_t *)malloc(0x10);
        vTrace_00->nCap = 100;
        vTrace_00->nSize = 0;
        piVar4 = (int *)malloc(400);
        vTrace_00->pArray = piVar4;
      }
      vXorLits = (Vec_Int_t *)malloc(0x10);
      vXorLits->nCap = 1000;
      vXorLits->nSize = 0;
      piVar4 = (int *)malloc(4000);
      vXorLits->pArray = piVar4;
      Gia_ManSetPhase(p);
      Gia_ManFillValue(p);
      if (fDualOut != 0) {
        Gia_ManEquivSetColors(p,fVerbose);
      }
      pGVar5 = Gia_ManStart(p->nObjs);
      pcVar16 = p->pName;
      if (pcVar16 == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        sVar6 = strlen(pcVar16);
        pcVar7 = (char *)malloc(sVar6 + 1);
        strcpy(pcVar7,pcVar16);
      }
      pGVar5->pName = pcVar7;
      pcVar16 = p->pSpec;
      if (pcVar16 == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        sVar6 = strlen(pcVar16);
        pcVar7 = (char *)malloc(sVar6 + 1);
        strcpy(pcVar7,pcVar16);
      }
      pGVar5->pSpec = pcVar7;
      Gia_ManHashAlloc(pGVar5);
      p->pObjs->Value = 0;
      pVVar9 = p->vCis;
      if (0 < pVVar9->nSize) {
        lVar15 = 0;
        do {
          iVar17 = pVVar9->pArray[lVar15];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00200006;
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          pGVar8 = Gia_ManAppendObj(pGVar5);
          uVar11 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
          *(ulong *)pGVar8 =
               uVar11 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = pGVar5->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + pGVar5->nObjs <= pGVar8)) {
LAB_00200025:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pGVar5->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = pGVar5->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + pGVar5->nObjs <= pGVar8)) goto LAB_00200025;
          pGVar2[iVar17].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
          lVar15 = lVar15 + 1;
          pVVar9 = p->vCis;
        } while (lVar15 < pVVar9->nSize);
      }
      iVar17 = p->nRegs;
      if (0 < iVar17) {
        iVar13 = 0;
        do {
          iVar1 = p->vCis->nSize;
          uVar12 = (iVar1 - iVar17) + iVar13;
          if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_00200044;
          iVar17 = p->vCis->pArray[uVar12];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00200006;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManSpecBuild(pGVar5,p,p->pObjs + iVar17,vXorLits,fDualOut,fSpeculate,vTrace_00,vTrace,
                           (Vec_Int_t *)0x0);
          iVar13 = iVar13 + 1;
          iVar17 = p->nRegs;
        } while (iVar13 < iVar17);
      }
      pVVar9 = p->vCos;
      if (0 < pVVar9->nSize) {
        lVar15 = 0;
        do {
          iVar17 = pVVar9->pArray[lVar15];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00200006;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar17;
          Gia_ManSpecReduce_rec
                    (pGVar5,p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vXorLits,
                     fDualOut,fSpeculate,vTrace_00,vTrace,(Vec_Int_t *)0x0);
          lVar15 = lVar15 + 1;
          pVVar9 = p->vCos;
        } while (lVar15 < pVVar9->nSize);
      }
      if ((fSynthesis == 0) && (uVar11 = (ulong)(uint)pVVar9->nSize, p->nRegs < pVVar9->nSize)) {
        lVar15 = 0;
        do {
          if ((int)uVar11 <= lVar15) goto LAB_00200044;
          iVar17 = pVVar9->pArray[lVar15];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00200006;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar17;
          uVar14 = (uint)*(undefined8 *)pGVar2;
          uVar12 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
          if ((int)uVar12 < 0) goto LAB_00200063;
          Gia_ManAppendCo(pGVar5,uVar14 >> 0x1d & 1 ^ uVar12);
          lVar15 = lVar15 + 1;
          pVVar9 = p->vCos;
          uVar11 = (ulong)pVVar9->nSize;
        } while (lVar15 < (long)(uVar11 - (long)p->nRegs));
      }
      iVar17 = vXorLits->nSize;
      if (0 < iVar17) {
        lVar15 = 0;
        do {
          Gia_ManAppendCo(pGVar5,vXorLits->pArray[lVar15]);
          lVar15 = lVar15 + 1;
          iVar17 = vXorLits->nSize;
        } while (lVar15 < iVar17);
      }
      if (iVar17 == 0) {
        Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
        Gia_ManAppendCo(pGVar5,0);
      }
      iVar17 = p->nRegs;
      if (0 < iVar17) {
        iVar13 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar12 = (iVar1 - iVar17) + iVar13;
          if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) {
LAB_00200044:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar17 = p->vCos->pArray[uVar12];
          if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) {
LAB_00200006:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar17;
          uVar14 = (uint)*(undefined8 *)pGVar2;
          uVar12 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
          if ((int)uVar12 < 0) {
LAB_00200063:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(pGVar5,uVar14 >> 0x1d & 1 ^ uVar12);
          iVar13 = iVar13 + 1;
          iVar17 = p->nRegs;
        } while (iVar13 < iVar17);
      }
      Gia_ManHashStop(pGVar5);
      if (vXorLits->pArray != (int *)0x0) {
        free(vXorLits->pArray);
      }
      free(vXorLits);
      Gia_ManSetRegNum(pGVar5,p->nRegs);
      pGVar10 = Gia_ManCleanup(pGVar5);
      Gia_ManStop(pGVar5);
      if ((fSkipSome != 0) && (0 < (long)vTrace->nSize)) {
        lVar15 = 0;
        iVar17 = 0;
        do {
          iVar17 = (iVar17 + 1) - (uint)(vTrace->pArray[lVar15] == 0);
          lVar15 = lVar15 + 1;
        } while (vTrace->nSize != lVar15);
        if ((iVar17 != 0) &&
           (pGVar10->vCos->nSize - pGVar10->nRegs != (iVar17 - p->nRegs) + p->vCos->nSize)) {
          __assert_fail("Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x4ee,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)")
          ;
        }
      }
      if (vTrace_00 != (Vec_Int_t *)0x0) {
        if (vTrace_00->pArray != (int *)0x0) {
          free(vTrace_00->pArray);
        }
        free(vTrace_00);
      }
      if (vTrace == (Vec_Int_t *)0x0) {
        return pGVar10;
      }
      if (vTrace->pArray != (int *)0x0) {
        free(vTrace->pArray);
      }
      free(vTrace);
      return pGVar10;
    }
    pcVar16 = "Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n";
  }
  Abc_Print(1,pcVar16);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduce( Gia_Man_t * p, int fDualOut, int fSynthesis, int fSpeculate, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    Vec_Int_t * vXorLits;
    int i, iLitNew;
    Vec_Int_t * vTrace = NULL, * vGuide = NULL;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    if ( fSkipSome )
    {
        vGuide = Vec_IntAlloc( 100 );
        pTemp  = Gia_ManSpecReduceTrace( p, vGuide, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p) );
        vTrace = Vec_IntAlloc( 100 );
    }
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    if ( !fSynthesis )
    {
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // update using trace
    if ( fSkipSome )
    {
        // count the number of non-zero entries
        int iLit, nAddPos = 0;
        Vec_IntForEachEntry( vGuide, iLit, i )
            if ( iLit )
                nAddPos++;
        if ( nAddPos )
            assert( Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos );
    }
    Vec_IntFreeP( &vTrace );
    Vec_IntFreeP( &vGuide );
    return pNew;
}